

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_32f1a0::NameType::printLeft(NameType *this,OutputStream *s)

{
  OutputStream *s_local;
  NameType *this_local;
  
  OutputStream::operator+=(s,this->Name);
  return;
}

Assistant:

void printLeft(OutputStream &s) const override { s += Name; }